

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piecewise_const_element_vector_provider.cc
# Opt level: O3

VectorXd __thiscall
projects::ipdg_stokes::assemble::PiecewiseConstElementVectorProvider::Eval
          (PiecewiseConstElementVectorProvider *this,Entity *entity)

{
  long *plVar1;
  double *pdVar2;
  double *pdVar3;
  double dVar4;
  undefined8 uVar5;
  bool bVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  PiecewiseConstElementVectorProvider *dst;
  Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *entity_00;
  int iVar10;
  undefined4 extraout_var;
  ulong uVar12;
  CoeffReturnType pdVar13;
  MatrixXd *pMVar14;
  undefined4 extraout_var_00;
  char *pcVar15;
  CoeffReturnType pdVar16;
  undefined8 *puVar17;
  Scalar *pSVar18;
  Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *in_RDX;
  ulong uVar19;
  Index extraout_RDX;
  long lVar20;
  long lVar21;
  long lVar22;
  PointerType ptr;
  double __tmp;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  int iVar29;
  undefined1 auVar28 [16];
  VectorXd VVar30;
  VectorXd *element_vector;
  VectorXd weights;
  MatrixXd grads;
  Matrix<double,_2,_3,_0,_2,_3> normals;
  Matrix<double,_2,_1,_0,_2,_1> f_eval;
  MatrixXd vertices;
  MatrixXd points;
  FeLagrangeO1Tria<double> hat_func;
  MatrixXd basis_funct;
  MatrixXd J_inv_trans;
  MatrixXd ref_grads;
  scalar_product_op<double,_double> local_1d9;
  PiecewiseConstElementVectorProvider *local_1d8;
  Lhs local_1d0;
  DenseStorage<double,__1,__1,_1,_0> local_1c8;
  undefined1 local_1b8 [16];
  long local_1a8;
  undefined1 local_198 [16];
  scalar_constant_op<double> local_188;
  scalar_constant_op<double> local_180;
  Matrix<double,_2,_3,_0,_2,_3> local_158;
  Index local_128;
  Entity *local_118;
  double dStack_110;
  Rhs local_108;
  Rhs local_f8;
  Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> local_f0;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_b8;
  Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *local_98;
  double dStack_90;
  long *local_88;
  FeLagrangeO1Tria<double> local_80;
  undefined1 local_78 [16];
  Index local_68;
  Lhs local_60;
  Rhs local_48;
  long *plVar11;
  
  local_1d8 = this;
  iVar10 = (*(code *)(in_RDX->
                     super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>
                     ).
                     super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>
                     .
                     super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>
                     .m_data[3])();
  plVar11 = (long *)CONCAT44(extraout_var,iVar10);
  local_80.super_ScalarReferenceFiniteElement<double>._vptr_ScalarReferenceFiniteElement =
       (ScalarReferenceFiniteElement<double>)&PTR__ScalarReferenceFiniteElement_004d01e0;
  local_f0.
  super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>.
  m_data = (PointerType)0x2;
  local_f0.
  super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>.
  m_cols.m_value = 0;
  local_198 = (undefined1  [16])0x0;
  local_188.m_other = 0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_198,2,1);
  Eigen::internal::
  resize_if_allowed<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>,double,double>
            ((Matrix<double,__1,__1,_0,__1,__1> *)local_198,
             (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
              *)&local_f0,(assign_op<double,_double> *)&local_60);
  lVar20 = (long)local_188.m_other * local_198._8_8_;
  uVar12 = lVar20 - (lVar20 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < lVar20) {
    lVar22 = 0;
    do {
      *(undefined1 (*) [16])
       (&(((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_198._0_8_)->m_storage).
         m_data + lVar22) = (undefined1  [16])0x0;
      lVar22 = lVar22 + 2;
    } while (lVar22 < (long)uVar12);
  }
  auVar9 = _DAT_003f4080;
  auVar8 = _DAT_003f4070;
  lVar22 = lVar20 % 2;
  if (lVar22 != 0 && (long)uVar12 <= lVar20) {
    lVar21 = lVar22 + -1;
    auVar23._8_4_ = (int)lVar21;
    auVar23._0_8_ = lVar21;
    auVar23._12_4_ = (int)((ulong)lVar21 >> 0x20);
    uVar12 = 0;
    auVar23 = auVar23 ^ _DAT_003f4080;
    do {
      auVar26._8_4_ = (int)uVar12;
      auVar26._0_8_ = uVar12;
      auVar26._12_4_ = (int)(uVar12 >> 0x20);
      auVar26 = (auVar26 | auVar8) ^ auVar9;
      bVar6 = auVar23._0_4_ < auVar26._0_4_;
      iVar10 = auVar23._4_4_;
      iVar29 = auVar26._4_4_;
      if ((bool)(~(iVar10 < iVar29 || iVar29 == iVar10 && bVar6) & 1)) {
        (&(((NestedExpressionType)(local_198._0_8_ + (lVar20 / 2) * 0x10))->
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data)[uVar12]
             = (double *)0x0;
      }
      if (iVar10 >= iVar29 && (iVar29 != iVar10 || !bVar6)) {
        (&(((NestedExpressionType)(local_198._0_8_ + (lVar20 / 2) * 0x10))->
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows)[uVar12]
             = 0;
      }
      uVar12 = uVar12 + 2;
    } while ((lVar22 + 1U & 0xfffffffffffffffe) != uVar12);
  }
  lf::uscalfe::FeLagrangeO1Tria<double>::GradientsReferenceShapeFunctions
            ((Matrix<double,__1,__1,_0,__1,__1> *)&local_158,&local_80,(MatrixXd *)local_198);
  local_b8.m_xpr = (Matrix<double,__1,__1,_0,__1,__1> *)&local_158;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_48,
             (DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)&local_b8);
  free((void *)local_158.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.m_storage.
               m_data.array[0]);
  free((void *)local_198._0_8_);
  local_198._0_8_ = (LhsNested)0x2;
  local_188.m_other = 0.0;
  local_158.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.m_storage.m_data.array[0] =
       0.0;
  local_158.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.m_storage.m_data.array[1] =
       0.0;
  local_158.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.m_storage.m_data.array[2] =
       0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_158,2,1);
  local_118 = (Entity *)local_188.m_other;
  dStack_110 = 0.0;
  Eigen::internal::
  resize_if_allowed<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>,double,double>
            ((Matrix<double,__1,__1,_0,__1,__1> *)&local_158,
             (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
              *)local_198,(assign_op<double,_double> *)&local_f0);
  lVar20 = (long)local_158.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.m_storage.
                 m_data.array[2] *
           (long)local_158.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.m_storage.
                 m_data.array[1];
  uVar12 = lVar20 - (lVar20 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < lVar20) {
    lVar22 = 0;
    do {
      plVar1 = (long *)((long)local_158.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>
                              .m_storage.m_data.array[0] + lVar22 * 8);
      *plVar1 = (long)local_118;
      plVar1[1] = (long)local_118;
      lVar22 = lVar22 + 2;
    } while (lVar22 < (long)uVar12);
  }
  auVar9 = _DAT_003f4080;
  auVar8 = _DAT_003f4070;
  lVar22 = lVar20 % 2;
  if (lVar22 != 0 && (long)uVar12 <= lVar20) {
    lVar21 = lVar22 + -1;
    auVar24._8_4_ = (int)lVar21;
    auVar24._0_8_ = lVar21;
    auVar24._12_4_ = (int)((ulong)lVar21 >> 0x20);
    uVar12 = 0;
    auVar24 = auVar24 ^ _DAT_003f4080;
    do {
      auVar27._8_4_ = (int)uVar12;
      auVar27._0_8_ = uVar12;
      auVar27._12_4_ = (int)(uVar12 >> 0x20);
      auVar23 = (auVar27 | auVar8) ^ auVar9;
      bVar6 = auVar24._0_4_ < auVar23._0_4_;
      iVar10 = auVar24._4_4_;
      iVar29 = auVar23._4_4_;
      if ((bool)(~(iVar10 < iVar29 || iVar29 == iVar10 && bVar6) & 1)) {
        *(Entity **)
         ((long)local_158.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.m_storage.
                m_data.array[0] + (lVar20 / 2) * 0x10 + uVar12 * 8) = local_118;
      }
      if (iVar10 >= iVar29 && (iVar29 != iVar10 || !bVar6)) {
        *(Entity **)
         ((long)local_158.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.m_storage.
                m_data.array[0] + (lVar20 / 2) * 0x10 + 8 + uVar12 * 8) = local_118;
      }
      uVar12 = uVar12 + 2;
    } while ((lVar22 + 1U & 0xfffffffffffffffe) != uVar12);
  }
  (**(code **)(*plVar11 + 0x28))(&local_60,plVar11,&local_158);
  local_98 = in_RDX;
  free((void *)local_158.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.m_storage.
               m_data.array[0]);
  Eigen::
  Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
  Product((Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
           *)&local_158,&local_60,&local_48);
  dVar4 = local_158.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.m_storage.m_data.
          array[0];
  dVar7 = local_158.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.m_storage.m_data.
          array[1];
  local_1b8 = (undefined1  [16])0x0;
  local_1a8 = 0;
  lVar20 = *(Index *)((long)local_158.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.
                            m_storage.m_data.array[0] + 8);
  lVar22 = *(Index *)((long)local_158.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.
                            m_storage.m_data.array[1] + 0x10);
  if ((lVar22 != 0 && lVar20 != 0) &&
     (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar22),0) < lVar20)) {
LAB_0017f925:
    puVar17 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar17 = &std::out_of_range::vtable;
    __cxa_throw(puVar17,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_1b8,lVar20,lVar22);
  lVar20 = *(Index *)((long)dVar4 + 8);
  lVar22 = *(Index *)((long)dVar7 + 0x10);
  if ((local_1b8._8_8_ != lVar20) || (local_1a8 != lVar22)) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_1b8,lVar20,lVar22
              );
  }
  Eigen::internal::
  generic_product_impl<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::DenseShape,Eigen::DenseShape,8>
  ::evalTo<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)local_1b8,
             (Matrix<double,__1,__1,_0,__1,__1> *)dVar4,(Matrix<double,__1,__1,_0,__1,__1> *)dVar7);
  local_78 = (undefined1  [16])0x0;
  local_68 = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_78,2,3);
  Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
            ((Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_198,
             (Matrix<double,__1,__1,_0,__1,__1> *)local_1b8,1);
  Eigen::CommaInitializer<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>>
            ((CommaInitializer<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_b8,
             (Matrix<double,__1,__1,_0,__1,__1> *)local_78,
             (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
              *)local_198);
  Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
            (&local_f0,(Matrix<double,__1,__1,_0,__1,__1> *)local_1b8,0);
  local_128 = local_f0.
              super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>
              .
              super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>
              .m_outerStride;
  local_158.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.m_storage.m_data.array[4] =
       (double)local_f0.
               super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>
               .
               super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>
               .m_startRow.m_value;
  local_158.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.m_storage.m_data.array[5] =
       (double)local_f0.
               super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>
               .
               super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>
               .m_startCol.m_value;
  local_158.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.m_storage.m_data.array[2] =
       (double)local_f0.
               super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>
               .
               super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>
               .
               super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>
               .m_cols.m_value;
  local_158.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.m_storage.m_data.array[3] =
       (double)local_f0.
               super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>
               .
               super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>
               .m_xpr;
  local_158.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.m_storage.m_data.array[0] =
       (double)local_f0.
               super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>
               .
               super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>
               .
               super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>
               .m_data;
  Eigen::CommaInitializer<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator_
            ((CommaInitializer<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_b8,
             (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>
              *)&local_158);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::finished(&local_b8);
  dst = local_1d8;
  local_158.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.m_storage.m_data.array[0] =
       2.96439387504748e-323;
  local_158.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.m_storage.m_data.array[2] =
       0.0;
  *(undefined1 (*) [16])local_1d8 = (undefined1  [16])0x0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_1d8,6,1);
  Eigen::internal::
  resize_if_allowed<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>,double,double>
            ((Matrix<double,__1,_1,_0,__1,_1> *)dst,
             (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
              *)&local_158,(assign_op<double,_double> *)local_198);
  auVar9 = _DAT_003f4080;
  auVar8 = _DAT_003f4070;
  lVar20 = *(long *)&(dst->f_).super__Function_base._M_functor;
  if (0 < lVar20) {
    dVar4 = local_1d8->sigma_;
    uVar12 = lVar20 + 0x1fffffffffffffff;
    uVar19 = uVar12 & 0x1fffffffffffffff;
    auVar25._8_4_ = (int)uVar19;
    auVar25._0_8_ = uVar19;
    auVar25._12_4_ = (int)(uVar19 >> 0x20);
    lVar20 = 0;
    auVar25 = auVar25 ^ _DAT_003f4080;
    do {
      auVar28._8_4_ = (int)lVar20;
      auVar28._0_8_ = lVar20;
      auVar28._12_4_ = (int)((ulong)lVar20 >> 0x20);
      auVar23 = (auVar28 | auVar8) ^ auVar9;
      if ((bool)(~(auVar23._4_4_ == auVar25._4_4_ && auVar25._0_4_ < auVar23._0_4_ ||
                  auVar25._4_4_ < auVar23._4_4_) & 1)) {
        *(double *)((long)dVar4 + lVar20 * 8) =
             local_158.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.m_storage.m_data
             .array[2];
      }
      if ((auVar23._12_4_ != auVar25._12_4_ || auVar23._8_4_ <= auVar25._8_4_) &&
          auVar23._12_4_ <= auVar25._12_4_) {
        *(double *)((long)dVar4 + 8 + lVar20 * 8) =
             local_158.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.m_storage.m_data
             .array[2];
      }
      lVar20 = lVar20 + 2;
    } while ((uVar19 - ((uint)uVar12 & 1)) + 2 != lVar20);
  }
  (**(code **)(*plVar11 + 0x18))(&local_b8,plVar11,entity + 6);
  (**(code **)(*plVar11 + 0x30))(&local_f0,plVar11,entity + 6);
  local_f8.m_expression = (NestedExpressionType)(entity + 9);
  local_108.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] =
       (double)&local_f0;
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   *)local_198,(Lhs *)&local_108,&local_f8,
                  (scalar_product_op<double,_double> *)&local_1d0);
  uVar5 = local_198._8_8_;
  local_158.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.m_storage.m_data.array[0] =
       (double)local_198._0_8_;
  local_158.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.m_storage.m_data.array[1] =
       (double)local_198._8_8_;
  local_1c8.m_data = (double *)0x0;
  local_1c8.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_1c8,
             (((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)uVar5)->m_storage).
             m_rows,1);
  lVar20 = *(long *)local_158.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.m_storage
                    .m_data.array[0];
  lVar22 = *(long *)local_158.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.m_storage
                    .m_data.array[1];
  Eigen::internal::
  resize_if_allowed<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,1,0,_1,1>>const,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,1,0,_1,1>const>const>const>,double,double>
            ((Matrix<double,__1,_1,_0,__1,_1> *)&local_1c8,
             (MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
              *)&local_158,(assign_op<double,_double> *)&local_1d0);
  uVar12 = local_1c8.m_rows - (local_1c8.m_rows >> 0x3f) & 0xfffffffffffffffe;
  if (1 < local_1c8.m_rows) {
    lVar21 = 0;
    do {
      pdVar2 = (double *)(lVar20 + lVar21 * 8);
      dVar4 = pdVar2[1];
      pdVar3 = (double *)(lVar22 + lVar21 * 8);
      dVar7 = pdVar3[1];
      local_1c8.m_data[lVar21] = *pdVar2 * *pdVar3;
      (local_1c8.m_data + lVar21)[1] = dVar4 * dVar7;
      lVar21 = lVar21 + 2;
    } while (lVar21 < (long)uVar12);
  }
  if ((long)uVar12 < local_1c8.m_rows) {
    do {
      local_1c8.m_data[uVar12] = *(double *)(lVar20 + uVar12 * 8) * *(double *)(lVar22 + uVar12 * 8)
      ;
      uVar12 = uVar12 + 1;
    } while (local_1c8.m_rows != uVar12);
  }
  local_88 = plVar11;
  free(local_f0.
       super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
       super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>.
       m_data);
  if (*(int *)&entity[8]._vptr_Entity != 0) {
    local_118 = entity + 1;
    uVar12 = 0;
    do {
      Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                ((Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)&local_158,
                 (Matrix<double,__1,__1,_0,__1,__1> *)&local_b8,uVar12);
      Eigen::PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::resize
                ((PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)local_198,
                 (Index)local_158.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.
                        m_storage.m_data.array[1],1);
      dVar4 = local_158.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.m_storage.
              m_data.array[0];
      Eigen::internal::
      resize_if_allowed<Eigen::Matrix<double,2,1,0,2,1>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,true>,double,double>
                ((Matrix<double,_2,_1,_0,_2,_1> *)local_198,
                 (Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)&local_158,
                 (assign_op<double,_double> *)&local_f0);
      local_198 = *(undefined1 (*) [16])dVar4;
      if (entity[3]._vptr_Entity == (_func_int **)0x0) {
        std::__throw_bad_function_call();
        goto LAB_0017f925;
      }
      (*(code *)entity[4]._vptr_Entity)
                (&local_108,local_118,
                 (Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0>
                  *)local_198);
      local_1d0.m_matrix = (non_const_type)local_78;
      pdVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)&local_1c8,
                           uVar12);
      local_f8.m_expression = (NestedExpressionType)*pdVar13;
      Eigen::
      CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>
      ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                        *)&local_158,
                       ((local_1d0.m_matrix)->
                       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                       m_cols,((local_1d0.m_matrix)->
                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                              m_storage.m_rows,(scalar_constant_op<double> *)&local_f8);
      Eigen::
      CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>_>
      ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
                       *)&local_f0,&local_1d0,
                      (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                       *)&local_158,&local_1d9);
      Eigen::
      Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>_>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0>
      ::Product((Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0>
                 *)local_198,(Lhs *)&local_f0,&local_108);
      Eigen::Block<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1,_1,_false>::Block
                ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)&local_158,
                 (Matrix<double,__1,_1,_0,__1,_1> *)local_1d8,0,0,3,1);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const>const>,Eigen::Matrix<double,2,1,0,2,1>,0>,Eigen::internal::add_assign_op<double,double>>
                ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)&local_158,
                 (Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0>
                  *)local_198,(add_assign_op<double,_double> *)&local_f8,(type)0x0);
      uVar12 = uVar12 + 1;
    } while (uVar12 < *(uint *)&entity[8]._vptr_Entity);
  }
  entity_00 = local_98;
  iVar10 = (*(code *)(local_98->
                     super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>
                     ).
                     super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>
                     .
                     super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>
                     .m_data[4])(local_98);
  local_158.super_PlainObjectBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>.m_storage.m_data.array[0].
  _0_1_ = (char)iVar10;
  pMVar14 = lf::base::RefEl::NodeCoords((RefEl *)&local_158);
  (**(code **)(*local_88 + 0x18))(&local_f0,local_88,pMVar14);
  ipdg_stokes::mesh::computeOutwardNormals(&local_158,(Entity *)entity_00);
  iVar10 = (*(code *)(entity_00->
                     super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>
                     ).
                     super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>
                     .
                     super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>
                     .m_data[1])(entity_00,1);
  lVar20 = 0;
  do {
    uVar5 = *(undefined8 *)(CONCAT44(extraout_var_00,iVar10) + lVar20 * 8);
    pcVar15 = (char *)(**(code **)*entity[0xb]._vptr_Entity)(entity[0xb]._vptr_Entity,uVar5);
    if (*pcVar15 == '\x01') {
      pdVar16 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>,_0>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>,_0> *)&local_158,1,
                           lVar20);
      local_108.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
      [0] = (double)((ulong)*pdVar16 ^ (ulong)DAT_003f4110);
      local_198._8_8_ = 0;
      local_198._0_8_ = &local_108;
      local_188.m_other = 4.94065645841247e-324;
      local_180.m_other = 4.94065645841247e-324;
      pdVar16 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>,_0>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>,_0> *)&local_158,0,
                           lVar20);
      Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::operator_
                ((CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)local_198,pdVar16);
      Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::finished
                ((CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)local_198);
      puVar17 = (undefined8 *)(**(code **)*entity[0xc]._vptr_Entity)(entity[0xc]._vptr_Entity,uVar5)
      ;
      local_198._0_8_ = (LhsNested)(local_198 + 8);
      local_118 = (Entity *)*puVar17;
      dStack_110 = (double)puVar17[1];
      local_98 = (Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)
                 local_108.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.
                 m_data.array[0];
      dStack_90 = local_108.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.
                  m_data.array[1];
      pSVar18 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_1d8,
                           lVar20 + 3);
      *pSVar18 = dStack_110 * dStack_90 + (double)local_118 * (double)local_98;
    }
    lVar20 = lVar20 + 1;
  } while (lVar20 != 3);
  free(local_f0.
       super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
       super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>.
       m_data);
  free(local_1c8.m_data);
  free(local_b8.m_xpr);
  free((void *)local_78._0_8_);
  free((void *)local_1b8._0_8_);
  free(local_60.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(local_48.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  VVar30.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  VVar30.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       &local_1d8->sigma_;
  return (VectorXd)VVar30.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

Eigen::VectorXd PiecewiseConstElementVectorProvider::Eval(
    const lf::mesh::Entity &entity) const {
  const auto *const geom = entity.Geometry();
  // Construct the basis functions from the curl of the standard hat functions
  const lf::uscalfe::FeLagrangeO1Tria<double> hat_func;
  const Eigen::MatrixXd ref_grads =
      hat_func.GradientsReferenceShapeFunctions(Eigen::VectorXd::Zero(2))
          .transpose();
  const Eigen::MatrixXd J_inv_trans =
      geom->JacobianInverseGramian(Eigen::VectorXd::Zero(2));
  const Eigen::MatrixXd grads = J_inv_trans * ref_grads;
  Eigen::MatrixXd basis_funct(2, 3);
  basis_funct << grads.row(1), -grads.row(0);
  // Compute the elements of the vector via the given quadrature rule
  Eigen::VectorXd element_vector = Eigen::VectorXd::Zero(6);
  const Eigen::MatrixXd points = geom->Global(quadrule_.Points());
  const Eigen::VectorXd weights =
      (geom->IntegrationElement(quadrule_.Points()).array() *
       quadrule_.Weights().array())
          .matrix();
  for (lf::base::size_type n = 0; n < quadrule_.NumPoints(); ++n) {
    const auto f_eval = f_(points.col(n));
    element_vector.head(3) += basis_funct.transpose() * weights[n] * f_eval;
  }
  // Weakly impose the dirichlet boundary conditions
  const Eigen::MatrixXd vertices = geom->Global(entity.RefEl().NodeCoords());
  // Use the vertex coordinates to compute the local normals on the edges
  const Eigen::Matrix<double, 2, 3> normals =
      projects::ipdg_stokes::mesh::computeOutwardNormals(entity);
  // Iterate over all edges of the current entity and set the boundary
  // conditions where necessary
  const auto edges = entity.SubEntities(1);
  for (int edge_idx = 0; edge_idx < 3; ++edge_idx) {
    const auto &edge = *edges[edge_idx];
    if (boundary_(edge)) {
      Eigen::Vector2d t;
      t << -normals(1, edge_idx), normals(0, edge_idx);
      element_vector[edge_idx + 3] = dirichlet_data_(edge).transpose() * t;
    }
  }
  return element_vector;
}